

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void __thiscall SchemaAdapter::ShowEnumOverlay(SchemaAdapter *this,EnumEntry *entry)

{
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_40;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_30;
  
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&local_30,&this->onChanged);
  cursespp::SchemaOverlay::ShowEnumOverlay(entry,(PrefsPtr *)&local_40,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void ShowEnumOverlay(const ISchema::EnumEntry* entry) {
            SchemaOverlay::ShowEnumOverlay(entry, prefs, onChanged);
        }